

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svgproperty.h
# Opt level: O2

float __thiscall
lunasvg::LengthContext::valueForLength(LengthContext *this,Length *length,LengthDirection direction)

{
  float fVar1;
  LengthUnits LVar2;
  float fVar3;
  
  LVar2 = length->m_units;
  if (LVar2 == Ex) {
    return length->m_value * this->m_element->m_font_size * 0.5;
  }
  if (LVar2 == Em) {
    return length->m_value * this->m_element->m_font_size;
  }
  if (LVar2 != Percent) {
    return length->m_value;
  }
  fVar1 = length->m_value;
  if (this->m_units != UserSpaceOnUse) {
    return fVar1 / 100.0;
  }
  fVar3 = viewportDimension(this,direction);
  return (fVar1 * fVar3) / 100.0;
}

Assistant:

float value() const { return m_value; }